

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O3

ASTNode * ParseReturn(Scope *scope,Lexer *lexer)

{
  int iVar1;
  ASTNode *pAVar2;
  ASTNode *pAVar3;
  
  iVar1 = scope->nodeSpot;
  scope->nodeSpot = iVar1 + 1;
  if (iVar1 < scope->nodeLength) {
    pAVar3 = scope->nodes + iVar1;
  }
  else {
    pAVar3 = (ASTNode *)0x0;
  }
  pAVar3->type = RETURN;
  pAVar2 = ParseExpression(scope,lexer);
  (pAVar3->meta).binaryExpr.left = pAVar2;
  pAVar3->isStmt = true;
  return pAVar3;
}

Assistant:

ASTNode* ParseReturn(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Return");
	TRACK();
	ASTNode* var = GetNextNode(scope);
	SET_NODE_TYPE(var, RETURN);
	SET_RETURN_VALUE(var, ParseExpression(scope, lexer));
	SET_IS_STMT(var);
	return var;
}